

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,IfStmt *stmt)

{
  element_type *peVar1;
  void *key;
  uint64_t uVar2;
  ulong local_70;
  ulong local_68;
  uint64_t hash;
  undefined1 local_50 [24];
  string var;
  uint64_t if_signature;
  IfStmt *stmt_local;
  HashVisitor *this_local;
  
  var.field_2._8_8_ = 0x3c6ef372fe94f82d;
  IfStmt::predicate((IfStmt *)local_50);
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_50);
  (*(peVar1->super_IRNode)._vptr_IRNode[0x1f])(local_50 + 0x10);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_50);
  key = (void *)std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::size();
  uVar2 = hash_64_fnv1a(key,uVar2);
  local_68 = uVar2 << ((byte)(this->super_IRVisitor).level & 0x3f);
  local_70 = local_68 ^ 0x3c6ef372fe94f82d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->stmt_hashes_,&local_70);
  std::__cxx11::string::~string((string *)(local_50 + 0x10));
  return;
}

Assistant:

void visit(IfStmt* stmt) override {
        // magic number comes from here https://stackoverflow.com/a/4948967
        // based on the requirements, warped shifting doesn't matter since it keeps
        // the number of 0 and 1 the same. And I don't think the shifting will
        // introduce any correlation either
        constexpr uint64_t if_signature = shift_const(0x9e3779b97f4a7c16, 1);
        auto var = stmt->predicate()->to_string();
        uint64_t hash = hash_64_fnv1a(var.c_str(), var.size()) << level;
        stmt_hashes_.emplace_back(if_signature ^ hash);
    }